

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_backward_Test::TestBody
          (IntrusiveListIteratorTest_rbegin_rend_backward_Test *this)

{
  IntrusiveListIteratorTest *pIVar1;
  bool bVar2;
  undefined8 *puVar3;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar4;
  TestObject *pTVar5;
  vector<int,_std::allocator<int>_> *expected;
  TestObject *pTVar6;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  unsigned_long local_80;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_78
  ;
  TestObject *local_68;
  IntrusiveListIteratorTest_rbegin_rend_backward_Test *local_60;
  AssertHelper local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  pTVar6 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_60 = this;
  puVar3 = (undefined8 *)operator_new(0xc);
  *puVar3 = &DAT_200000001;
  *(undefined4 *)(puVar3 + 1) = 3;
  local_80 = 0;
  if (pTVar6 != (TestObject *)0x0) {
    pIVar1 = &local_60->super_IntrusiveListIteratorTest;
    do {
      pTVar6 = (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      pTVar5 = pTVar6;
      if (pTVar6 == (TestObject *)0x0) {
        pTVar5 = (TestObject *)&pIVar1->list_;
      }
      if (((TestObjectList *)pTVar5)->last_ == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0xa0,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_78,"expected[count]","last->data",
                 (int *)((long)puVar3 + local_80 * 4),&((TestObjectList *)pTVar5)->last_->data);
      if (local_78.current.list_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        if (local_78.current.node_ == (TestObject *)0x0) {
          pTVar6 = (TestObject *)0x27b2e1;
        }
        else {
          pTVar6 = ((local_78.current.node_)->
                   super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,0xae,(char *)pTVar6);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
          local_88.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_78.current.node_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_001e254f;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_78.current.node_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_80 = local_80 + 1;
    } while (pTVar6 != (TestObject *)0x0);
  }
  local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_78,"count","expected.size()",&local_80,(unsigned_long *)&local_88);
  if (local_78.current.list_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78.current.node_ == (TestObject *)0x0) {
      pTVar6 = (TestObject *)0x27b2e1;
    }
    else {
      pTVar6 = ((local_78.current.node_)->
               super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
               ,0xb1,(char *)pTVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.current.node_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001e254f:
  operator_delete(puVar3);
  local_50.current.list_ = (local_60->super_IntrusiveListIteratorTest).clist_;
  expected = (vector<int,_std::allocator<int>_> *)0x0;
  local_38 = 0;
  local_50.current.node_ = (local_50.current.list_)->first_;
  local_68 = (TestObject *)0x0;
  local_78.current.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)0x0;
  local_78.current.node_ = (TestObject *)0x0;
  local_40 = local_50.current.list_;
  piVar4 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_78.current.node_ = (TestObject *)((long)&piVar4->last_ + 4);
  piVar4->first_ = (TestObject *)&DAT_200000001;
  *(undefined4 *)&piVar4->last_ = 3;
  local_78.current.list_ = piVar4;
  local_68 = local_78.current.node_;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,&local_78,expected);
  operator_delete(piVar4);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_backward) {
  TestBackward(list_.rbegin(), list_.rend(), {1, 2, 3});
  TestBackward(clist_.rbegin(), clist_.rend(), {1, 2, 3});
}